

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_connecter_base.cpp
# Opt level: O1

int __thiscall zmq::stream_connecter_base_t::get_new_reconnect_ivl(stream_connecter_base_t *this)

{
  int iVar1;
  uint32_t uVar2;
  int iVar3;
  uint uVar4;
  int *piVar5;
  int local_c;
  
  uVar2 = generate_random();
  uVar4 = (this->super_own_t).options.reconnect_ivl;
  iVar3 = (this->super_own_t).options.reconnect_ivl_max;
  iVar1 = this->_current_reconnect_ivl;
  if ((int)uVar4 < iVar3 && 0 < iVar3) {
    piVar5 = &(this->super_own_t).options.reconnect_ivl_max;
    if (iVar1 < 0x3fffffff) {
      local_c = iVar1 * 2;
      if (SBORROW4(iVar3,iVar1 * 2) == iVar3 + iVar1 * -2 < 0) {
        piVar5 = &local_c;
      }
    }
    this->_current_reconnect_ivl = *piVar5;
  }
  uVar4 = uVar2 % uVar4;
  iVar3 = uVar4 + iVar1;
  if ((int)(uVar4 ^ 0x7fffffff) <= iVar1) {
    iVar3 = 0x7fffffff;
  }
  return iVar3;
}

Assistant:

int zmq::stream_connecter_base_t::get_new_reconnect_ivl ()
{
    //  TODO should the random jitter be really based on the configured initial
    //  reconnect interval options.reconnect_ivl, or better on the
    //  _current_reconnect_ivl?

    //  The new interval is the current interval + random value.
    const int random_jitter = generate_random () % options.reconnect_ivl;
    const int interval =
      _current_reconnect_ivl < std::numeric_limits<int>::max () - random_jitter
        ? _current_reconnect_ivl + random_jitter
        : std::numeric_limits<int>::max ();

    //  Only change the new current reconnect interval if the maximum reconnect
    //  interval was set and if it's larger than the reconnect interval.
    if (options.reconnect_ivl_max > 0
        && options.reconnect_ivl_max > options.reconnect_ivl) {
        //  Calculate the next interval
        _current_reconnect_ivl =
          _current_reconnect_ivl < std::numeric_limits<int>::max () / 2
            ? std::min (_current_reconnect_ivl * 2, options.reconnect_ivl_max)
            : options.reconnect_ivl_max;
    }

    return interval;
}